

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O2

void __thiscall
CfgNode::BlockData::addSignalHandler
          (BlockData *this,int sigid,CFG *handler,unsigned_long_long count)

{
  _Base_ptr *pp_Var1;
  iterator iVar2;
  mapped_type pCVar3;
  mapped_type *ppCVar4;
  int sigid_local;
  
  sigid_local = sigid;
  if (sigid < 0) {
    __assert_fail("sigid >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                  ,0xb6,"void CfgNode::BlockData::addSignalHandler(int, CFG *, unsigned long long)")
    ;
  }
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_CfgSignalHandler_*>,_std::_Select1st<std::pair<const_int,_CfgSignalHandler_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
          ::find(&(this->m_signalHandlers)._M_t,&sigid_local);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header) {
    pCVar3 = (mapped_type)operator_new(0x20);
    pCVar3->_vptr_CfgSignalHandler = (_func_int **)&PTR__CfgSignalHandler_00129908;
    pCVar3->m_sigid = sigid_local;
    pCVar3->m_handler = handler;
    pCVar3->m_count = count;
    ppCVar4 = std::
              map<int,_CfgSignalHandler_*,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
              ::operator[](&this->m_signalHandlers,&sigid_local);
    *ppCVar4 = pCVar3;
  }
  else {
    if ((iVar2._M_node[1]._M_parent)->_M_left->_M_parent != (_Base_ptr)handler->m_addr) {
      __assert_fail("cfgSignalHandler->handler()->addr() == handler->addr()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CfgNode.cpp"
                    ,0xbb,
                    "void CfgNode::BlockData::addSignalHandler(int, CFG *, unsigned long long)");
    }
    pp_Var1 = &(iVar2._M_node[1]._M_parent)->_M_right;
    *pp_Var1 = (_Base_ptr)((long)&(*pp_Var1)->_M_color + count);
  }
  return;
}

Assistant:

void CfgNode::BlockData::addSignalHandler(int sigid, CFG* handler, unsigned long long count) {
	assert(sigid >= 0);

	std::map<int, CfgSignalHandler*>::const_iterator it = m_signalHandlers.find(sigid);
	if (it != m_signalHandlers.end()) {
		CfgSignalHandler* cfgSignalHandler = it->second;
		assert(cfgSignalHandler->handler()->addr() == handler->addr());
		cfgSignalHandler->updateCount(count);
	} else {
		CfgSignalHandler* cfgSignalHandler = new CfgSignalHandler(sigid, handler, count);
		m_signalHandlers[sigid] = cfgSignalHandler;
	}
}